

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

id_type __thiscall
Darts::Details::DawgBuilder::find_node(DawgBuilder *this,id_type node_id,id_type *hash_id)

{
  id_type unit_id;
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  
  uVar3 = hash_node(this,node_id);
  while( true ) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->table_).size_;
    *hash_id = SUB164(ZEXT416(uVar3) % auVar1,0);
    unit_id = *(id_type *)((this->table_).buf_.array_ + SUB168(ZEXT416(uVar3) % auVar1,0) * 4);
    if (unit_id == 0) {
      return 0;
    }
    bVar2 = are_equal(this,node_id,unit_id);
    if (bVar2) break;
    uVar3 = *hash_id + 1;
  }
  return unit_id;
}

Assistant:

inline id_type DawgBuilder::find_node(id_type node_id,
    id_type *hash_id) const {
  *hash_id = hash_node(node_id) % table_.size();
  for ( ; ; *hash_id = (*hash_id + 1) % table_.size()) {
    id_type unit_id = table_[*hash_id];
    if (unit_id == 0) {
      break;
    }

    if (are_equal(node_id, unit_id)) {
      return unit_id;
    }
  }
  return 0;
}